

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O3

void __thiscall amrex::BoxDomain::add(BoxDomain *this,Box *b)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pBVar4;
  bool bVar5;
  long lVar6;
  Box *pBVar7;
  long lVar8;
  Box *pBVar9;
  iterator __beg;
  long lVar10;
  pointer b_00;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> check;
  void *local_98;
  void *pvStack_90;
  long local_88;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> local_78;
  BoxList *local_60;
  pointer local_58;
  BoxList local_50;
  
  local_98 = (void *)0x0;
  pvStack_90 = (void *)0x0;
  local_88 = 0;
  local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (Box *)0x0;
  local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Box *)0x0;
  std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
            ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_78,(iterator)0x0,b);
  b_00 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data
         ._M_start;
  local_58 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60 = &this->super_BoxList;
  if (b_00 != local_58) {
    do {
      pBVar4 = local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar9 = local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvStack_90 != local_98) {
        pvStack_90 = local_98;
      }
      for (; pBVar9 != pBVar4; pBVar9 = pBVar9 + 1) {
        bVar5 = Box::intersects(pBVar9,b_00);
        if (bVar5) {
          boxDiff(&local_50,pBVar9,b_00);
          std::vector<amrex::Box,std::allocator<amrex::Box>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                    ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_98,pvStack_90,
                     local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          (pBVar9->smallend).vect[0] = 1;
          (pBVar9->smallend).vect[1] = 1;
          (pBVar9->smallend).vect[2] = 1;
          (pBVar9->bigend).vect[0] = 0;
          (pBVar9->bigend).vect[1] = 0;
          *(undefined8 *)((pBVar9->bigend).vect + 2) = 0;
          if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_50.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      lVar6 = (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
      lVar10 = (lVar6 >> 2) * 0x6db6db6db6db6db7 >> 2;
      lVar8 = lVar6;
      pBVar9 = local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < lVar10) {
        pBVar9 = local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar10 * 4;
        lVar10 = lVar10 + 1;
        pBVar7 = local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + 2;
        do {
          if ((((pBVar7[-2].bigend.vect[0] < pBVar7[-2].smallend.vect[0]) ||
               (pBVar7[-2].bigend.vect[1] < pBVar7[-2].smallend.vect[1])) ||
              (pBVar7[-2].bigend.vect[2] < pBVar7[-2].smallend.vect[2])) ||
             (7 < pBVar7[-2].btype.itype)) {
            pBVar7 = pBVar7 + -2;
            goto LAB_005515a6;
          }
          if (((pBVar7[-1].bigend.vect[0] < pBVar7[-1].smallend.vect[0]) ||
              (pBVar7[-1].bigend.vect[1] < pBVar7[-1].smallend.vect[1])) ||
             ((pBVar7[-1].bigend.vect[2] < pBVar7[-1].smallend.vect[2] ||
              (7 < pBVar7[-1].btype.itype)))) {
            pBVar7 = pBVar7 + -1;
            goto LAB_005515a6;
          }
          if ((((pBVar7->bigend).vect[0] < (pBVar7->smallend).vect[0]) ||
              ((pBVar7->bigend).vect[1] < (pBVar7->smallend).vect[1])) ||
             (((pBVar7->bigend).vect[2] < (pBVar7->smallend).vect[2] || (7 < (pBVar7->btype).itype))
             )) goto LAB_005515a6;
          if ((((pBVar7[1].bigend.vect[0] < pBVar7[1].smallend.vect[0]) ||
               (pBVar7[1].bigend.vect[1] < pBVar7[1].smallend.vect[1])) ||
              (pBVar7[1].bigend.vect[2] < pBVar7[1].smallend.vect[2])) ||
             (7 < pBVar7[1].btype.itype)) {
            pBVar7 = pBVar7 + 1;
            goto LAB_005515a6;
          }
          lVar10 = lVar10 + -1;
          pBVar7 = pBVar7 + 4;
        } while (1 < lVar10);
        lVar8 = (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pBVar9;
      }
      lVar8 = (lVar8 >> 2) * 0x6db6db6db6db6db7;
      if (lVar8 == 1) {
LAB_00551572:
        pBVar7 = pBVar9;
        if (((((pBVar9->smallend).vect[0] <= (pBVar9->bigend).vect[0]) &&
             ((pBVar9->smallend).vect[1] <= (pBVar9->bigend).vect[1])) &&
            ((pBVar9->smallend).vect[2] <= (pBVar9->bigend).vect[2])) && ((pBVar9->btype).itype < 8)
           ) {
          pBVar7 = local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
LAB_005515a6:
        pBVar9 = pBVar7 + 1;
        if (pBVar9 != local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish &&
            pBVar7 != local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          do {
            if ((((pBVar9->smallend).vect[0] <= (pBVar9->bigend).vect[0]) &&
                ((pBVar9->smallend).vect[1] <= (pBVar9->bigend).vect[1])) &&
               (((pBVar9->smallend).vect[2] <= (pBVar9->bigend).vect[2] &&
                ((pBVar9->btype).itype < 8)))) {
              uVar1 = *(undefined8 *)(pBVar9->smallend).vect;
              uVar2 = *(undefined8 *)((pBVar9->smallend).vect + 2);
              uVar3 = *(undefined8 *)((pBVar9->bigend).vect + 2);
              *(undefined8 *)(pBVar7->bigend).vect = *(undefined8 *)(pBVar9->bigend).vect;
              *(undefined8 *)((pBVar7->bigend).vect + 2) = uVar3;
              *(undefined8 *)(pBVar7->smallend).vect = uVar1;
              *(undefined8 *)((pBVar7->smallend).vect + 2) = uVar2;
              pBVar7 = pBVar7 + 1;
            }
            pBVar9 = pBVar9 + 1;
          } while (pBVar9 != local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish);
        }
        if (pBVar7 != local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          lVar6 = (long)pBVar7 -
                  (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start;
          local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish = pBVar7;
        }
      }
      else {
        if (lVar8 == 2) {
LAB_00551551:
          pBVar7 = pBVar9;
          if ((((pBVar9->smallend).vect[0] <= (pBVar9->bigend).vect[0]) &&
              ((pBVar9->smallend).vect[1] <= (pBVar9->bigend).vect[1])) &&
             (((pBVar9->smallend).vect[2] <= (pBVar9->bigend).vect[2] && ((pBVar9->btype).itype < 8)
              ))) {
            pBVar9 = pBVar9 + 1;
            goto LAB_00551572;
          }
          goto LAB_005515a6;
        }
        if (lVar8 == 3) {
          pBVar7 = pBVar9;
          if ((((pBVar9->smallend).vect[0] <= (pBVar9->bigend).vect[0]) &&
              ((pBVar9->smallend).vect[1] <= (pBVar9->bigend).vect[1])) &&
             (((pBVar9->smallend).vect[2] <= (pBVar9->bigend).vect[2] && ((pBVar9->btype).itype < 8)
              ))) {
            pBVar9 = pBVar9 + 1;
            goto LAB_00551551;
          }
          goto LAB_005515a6;
        }
      }
      std::vector<amrex::Box,std::allocator<amrex::Box>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<amrex::Box*,std::vector<amrex::Box,std::allocator<amrex::Box>>>>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_78,
                 (long)((local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_start)->smallend).vect + lVar6,local_98,
                 pvStack_90);
      b_00 = b_00 + 1;
    } while (b_00 != local_58);
  }
  BoxList::join(local_60,&local_78);
  if (local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  return;
}

Assistant:

void
BoxDomain::add (const Box& b)
{
    BL_ASSERT(b.ixType() == ixType());

    Vector<Box> tmp, check;

    check.push_back(b);

    for (const auto& bx : *this)
    {
        tmp.clear();
        for (auto& cbx : check)
        {
            if (cbx.intersects(bx))
            {
                const BoxList& tmpbl = amrex::boxDiff(cbx, bx);
                tmp.insert(std::end(tmp), std::begin(tmpbl), std::end(tmpbl));
                cbx = Box();
            }
        }
        check.erase(std::remove_if(check.begin(), check.end(),
                                   [](const Box& x) { return x.isEmpty(); }),
                    check.end());
        check.insert(std::end(check), std::begin(tmp), std::end(tmp));
    }
    join(check);
    BL_ASSERT(ok());
}